

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

Float pbrt::SampleCatmullRom2D
                (span<const_float> nodes1,span<const_float> nodes2,span<const_float> values,
                span<const_float> cdf,Float alpha,Float u,Float *fval,Float *pdf)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  ulong uVar13;
  int iVar14;
  float *pfVar15;
  ulong uVar16;
  float *pfVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  bool bVar22;
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Float FVar31;
  undefined1 auVar32 [64];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [64];
  float fVar36;
  undefined1 auVar37 [64];
  float fVar38;
  float fVar39;
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  span<float> weights;
  int local_4c;
  float local_48 [5];
  float local_34;
  
  auVar25 = in_ZMM17._0_16_;
  pfVar17 = values.ptr;
  uVar13 = nodes2.n;
  pfVar15 = nodes2.ptr;
  weights.n = 4;
  weights.ptr = local_48;
  local_34 = u;
  bVar12 = CatmullRomWeights(nodes1,alpha,&local_4c,weights);
  FVar31 = 0.0;
  if (bVar12) {
    lVar18 = 0;
    auVar32 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      fVar39 = local_48[lVar18];
      if ((fVar39 != 0.0) || (NAN(fVar39))) {
        auVar9 = vfmadd231ss_fma(auVar32._0_16_,ZEXT416((uint)fVar39),
                                 ZEXT416(*(uint *)((long)cdf.ptr +
                                                  (long)(local_4c + (int)lVar18) * uVar13 * 4 +
                                                  ((long)((uVar13 << 0x20) + -0x100000000) >> 0x1e))
                                        ));
        auVar32 = ZEXT1664(auVar9);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != 4);
    fVar39 = auVar32._0_4_ * local_34;
    uVar16 = uVar13 - 2;
    if ((long)uVar16 < 1) {
      lVar18 = 1;
    }
    else {
      lVar18 = 1;
      uVar19 = uVar16;
      do {
        uVar20 = uVar19 >> 1;
        lVar21 = 0;
        auVar35 = ZEXT1664(ZEXT816(0) << 0x40);
        do {
          fVar1 = local_48[lVar21];
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            auVar9 = vfmadd231ss_fma(auVar35._0_16_,ZEXT416((uint)fVar1),
                                     ZEXT416((uint)cdf.ptr[(long)(int)(uVar20 + lVar18) +
                                                           (long)(local_4c + (int)lVar21) * uVar13])
                                    );
            auVar35 = ZEXT1664(auVar9);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 != 4);
        uVar19 = uVar19 + ~uVar20;
        lVar21 = uVar20 + lVar18 + 1;
        if (fVar39 < auVar35._0_4_) {
          uVar19 = uVar20;
          lVar21 = lVar18;
        }
        lVar18 = lVar21;
      } while (0 < (long)uVar19);
    }
    if (lVar18 - 1U < uVar16) {
      uVar16 = lVar18 - 1U;
    }
    uVar19 = 0;
    if (lVar18 < 1) {
      uVar16 = uVar19;
    }
    iVar14 = (int)uVar16;
    auVar35 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      fVar1 = local_48[uVar19];
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        auVar9 = vfmadd231ss_fma(auVar35._0_16_,ZEXT416((uint)fVar1),
                                 ZEXT416((uint)pfVar17[(long)iVar14 +
                                                       (long)(local_4c + (int)uVar19) * uVar13]));
        auVar35 = ZEXT1664(auVar9);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 != 4);
    lVar18 = (uVar16 << 0x20) + 0x100000000;
    lVar21 = 0;
    auVar37 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      fVar1 = local_48[lVar21];
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        auVar9 = vfmadd231ss_fma(auVar37._0_16_,ZEXT416((uint)fVar1),
                                 ZEXT416(*(uint *)((long)pfVar17 +
                                                  (long)(local_4c + (int)lVar21) * uVar13 * 4 +
                                                  (lVar18 >> 0x1e))));
        auVar37 = ZEXT1664(auVar9);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 4);
    fVar1 = pfVar15[iVar14];
    lVar21 = 0;
    auVar40 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      fVar2 = local_48[lVar21];
      if ((fVar2 != 0.0) || (NAN(fVar2))) {
        auVar9 = vfmadd231ss_fma(auVar40._0_16_,ZEXT416((uint)fVar2),
                                 ZEXT416((uint)cdf.ptr[(long)iVar14 +
                                                       (long)(local_4c + (int)lVar21) * uVar13]));
        auVar40 = ZEXT1664(auVar9);
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != 4);
    fVar2 = pfVar15[lVar18 >> 0x20] - fVar1;
    fVar36 = auVar37._0_4_;
    fVar33 = auVar35._0_4_;
    if (iVar14 < 1) {
      fVar38 = fVar36 - fVar33;
    }
    else {
      lVar21 = 0;
      auVar41 = ZEXT864(0);
      do {
        fVar38 = local_48[lVar21];
        if ((fVar38 != 0.0) || (NAN(fVar38))) {
          auVar9 = vfmadd231ss_fma(auVar41._0_16_,ZEXT416((uint)fVar38),
                                   ZEXT416((uint)pfVar17[(long)iVar14 +
                                                         (long)(local_4c + (int)lVar21) * uVar13 +
                                                         -1]));
          auVar41 = ZEXT1664(auVar9);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != 4);
      fVar38 = (fVar2 * (fVar36 - auVar41._0_4_)) / (pfVar15[lVar18 >> 0x20] - pfVar15[iVar14 - 1]);
    }
    fVar39 = (fVar39 - auVar40._0_4_) / fVar2;
    uVar16 = (ulong)(iVar14 + 2);
    bVar12 = uVar16 < uVar13;
    bVar22 = uVar16 == uVar13;
    if (bVar12) {
      uVar19 = 0;
      auVar40 = ZEXT1664(ZEXT816(0) << 0x40);
      do {
        fVar42 = local_48[uVar19];
        if ((fVar42 != 0.0) || (NAN(fVar42))) {
          auVar9 = vfmadd231ss_fma(auVar40._0_16_,ZEXT416((uint)fVar42),
                                   ZEXT416((uint)pfVar17[uVar16 + (long)(local_4c + (int)uVar19) *
                                                                  uVar13]));
          auVar40 = ZEXT1664(auVar9);
        }
        uVar19 = uVar19 + 1;
        bVar12 = uVar19 < 4;
        bVar22 = uVar19 == 4;
      } while (!bVar22);
      fVar42 = (fVar2 * (auVar40._0_4_ - fVar33)) / (pfVar15[uVar16] - fVar1);
    }
    else {
      fVar42 = fVar36 - fVar33;
    }
    fVar3 = fVar38 * 0.5;
    auVar11 = vfmsub231ss_fma(ZEXT416((uint)fVar42),ZEXT416((uint)fVar38),ZEXT416(0xc0000000));
    auVar9 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3eaaaaab),0),auVar11,auVar37._0_16_);
    fVar4 = auVar9._0_4_ - fVar33;
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)((fVar33 - fVar36) * 0.5)),
                              ZEXT416((uint)(fVar42 + fVar38)),ZEXT416(0x3e800000));
    auVar27 = ZEXT816(0) << 0x20;
    auVar9 = vfmadd213ss_fma(ZEXT816(0) << 0x40,auVar10,ZEXT416((uint)fVar4));
    auVar9 = vfmadd213ss_fma(auVar9,auVar27,ZEXT416((uint)fVar3));
    auVar34 = auVar35._0_16_;
    auVar9 = vfmadd213ss_fma(auVar9,auVar27,auVar34);
    auVar26 = vfmadd213ss_fma(auVar9,auVar27,auVar27);
    auVar9 = vfmadd132ss_fma(ZEXT416((uint)(fVar36 - fVar33)),auVar11,ZEXT416(0x40400000));
    auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar42 + fVar38)),ZEXT416((uint)(fVar33 - fVar36)),
                              ZEXT416(0x40000000));
    fVar36 = auVar26._0_4_ - fVar39;
    auVar26 = ZEXT416((uint)(auVar11._0_4_ + auVar9._0_4_ + fVar38 + fVar33));
    auVar24._8_4_ = 0x7fffffff;
    auVar24._0_8_ = 0x7fffffff7fffffff;
    auVar24._12_4_ = 0x7fffffff;
    auVar24 = vandps_avx512vl(ZEXT416((uint)fVar36),auVar24);
    vucomiss_avx512f(auVar24);
    if (bVar12 || bVar22) {
      auVar24 = vaddss_avx512f(auVar10,ZEXT416((uint)fVar4));
      auVar24 = vaddss_avx512f(ZEXT416((uint)fVar3),auVar24);
      auVar24 = vaddss_avx512f(auVar34,auVar24);
      auVar24 = vaddss_avx512f(auVar24,auVar27);
      fVar33 = auVar24._0_4_ - fVar39;
      auVar27._8_4_ = 0x7fffffff;
      auVar27._0_8_ = 0x7fffffff7fffffff;
      auVar27._12_4_ = 0x7fffffff;
      auVar24 = vandps_avx512vl(ZEXT416((uint)fVar33),auVar27);
      vucomiss_avx512f(auVar24);
      if (bVar12 || bVar22) {
        auVar43 = ZEXT816(0) << 0x20;
        auVar24 = vsubss_avx512f(auVar43,ZEXT416((uint)(fVar36 / (fVar33 - fVar36))));
        auVar35 = ZEXT464(0x3f800000);
        uVar5 = vcmpps_avx512vl(ZEXT416((uint)fVar36),auVar43,1);
        auVar44._8_4_ = 0x7fffffff;
        auVar44._0_8_ = 0x7fffffff7fffffff;
        auVar44._12_4_ = 0x7fffffff;
        auVar25 = vxorps_avx512vl(auVar25,auVar25);
        do {
          auVar26 = vaddss_avx512f(auVar35._0_16_,auVar25);
          fVar33 = auVar26._0_4_ * 0.5;
          uVar7 = vcmpss_avx512f(auVar24,auVar35._0_16_,1);
          bVar12 = (bool)((byte)uVar7 & 1);
          uVar7 = vcmpss_avx512f(auVar25,auVar24,1);
          bVar22 = (bool)((byte)uVar7 & 1);
          uVar23 = (uint)bVar22 * ((uint)bVar12 * auVar24._0_4_ + (uint)!bVar12 * (int)fVar33) +
                   (uint)!bVar22 * (int)fVar33;
          auVar24 = ZEXT416(uVar23);
          auVar26 = vfmadd213ss_avx512f(auVar10,auVar24,ZEXT416((uint)fVar4));
          auVar26 = vfmadd213ss_avx512f(auVar26,auVar24,ZEXT416((uint)fVar3));
          auVar26 = vfmadd213ss_avx512f(auVar26,auVar24,auVar34);
          auVar27 = vfmadd213ss_avx512f(auVar26,auVar24,auVar43);
          auVar26 = vfmadd213ss_fma(auVar11,auVar24,auVar9);
          auVar26 = vfmadd213ss_fma(auVar26,auVar24,ZEXT416((uint)fVar38));
          auVar26 = vfmadd213ss_fma(auVar26,auVar24,auVar34);
          auVar27 = vsubss_avx512f(auVar27,ZEXT416((uint)fVar39));
          uVar7 = vcmpps_avx512vl(auVar27,auVar43,5);
          bVar8 = (byte)uVar5 ^ (byte)uVar7;
          auVar28 = ZEXT416((uint)(bVar8 & 1) * auVar35._0_4_ + !(bool)(bVar8 & 1) * uVar23);
          auVar25._0_4_ = (bVar8 & 1) * uVar23 + (uint)!(bool)(bVar8 & 1) * auVar25._0_4_;
          auVar29 = vsubss_avx512f(auVar28,auVar25);
          auVar30 = vandps_avx512vl(auVar27,auVar44);
          uVar7 = vcmpps_avx512vl(auVar30,ZEXT416(0x358637bd),5);
          uVar6 = vcmpps_avx512vl(auVar29,ZEXT416(0x358637bd),5);
          bVar12 = (bool)((byte)uVar7 & (byte)uVar6 & 1);
          auVar27 = vdivss_avx512f(auVar27,auVar26);
          auVar24 = vsubss_avx512f(auVar24,auVar27);
          auVar24 = ZEXT416((uint)bVar12 * auVar24._0_4_ + !bVar12 * uVar23);
          auVar27 = ZEXT416((uint)bVar12 * in_ZMM18._0_4_ + !bVar12 * uVar23);
          auVar35 = ZEXT1664(auVar28);
          in_ZMM18 = ZEXT1664(auVar27);
        } while (bVar12 != false);
      }
      else {
        auVar27 = SUB6416(ZEXT464(0x3f800000),0);
      }
    }
    if (fval != (Float *)0x0) {
      *fval = auVar26._0_4_;
    }
    if (pdf != (Float *)0x0) {
      *pdf = auVar26._0_4_ / auVar32._0_4_;
    }
    auVar25 = vfmadd213ss_fma(auVar27,ZEXT416((uint)fVar2),ZEXT416((uint)fVar1));
    FVar31 = auVar25._0_4_;
  }
  return FVar31;
}

Assistant:

Float SampleCatmullRom2D(pstd::span<const Float> nodes1, pstd::span<const Float> nodes2,
                         pstd::span<const Float> values, pstd::span<const Float> cdf,
                         Float alpha, Float u, Float *fval, Float *pdf) {
    // Determine offset and coefficients for the _alpha_ parameter
    int offset;
    Float weights[4];
    if (!CatmullRomWeights(nodes1, alpha, &offset, weights))
        return 0;

    // Define a lambda function to interpolate table entries
    auto interpolate = [&](pstd::span<const Float> array, int idx) {
        Float value = 0;
        for (int i = 0; i < 4; ++i)
            if (weights[i] != 0)
                value += array[(offset + i) * nodes2.size() + idx] * weights[i];
        return value;
    };

    // Map _u_ to a spline interval by inverting the interpolated _cdf_
    Float maximum = interpolate(cdf, nodes2.size() - 1);
    u *= maximum;
    int idx =
        FindInterval(nodes2.size(), [&](int i) { return interpolate(cdf, i) <= u; });

    // Look up node positions and interpolated function values
    Float f0 = interpolate(values, idx), f1 = interpolate(values, idx + 1);
    Float x0 = nodes2[idx], x1 = nodes2[idx + 1];
    Float width = x1 - x0;
    Float d0, d1;

    // Re-scale _u_ using the interpolated _cdf_
    u = (u - interpolate(cdf, idx)) / width;

    // Approximate derivatives using finite differences of the interpolant
    if (idx > 0)
        d0 = width * (f1 - interpolate(values, idx - 1)) / (x1 - nodes2[idx - 1]);
    else
        d0 = f1 - f0;
    if (idx + 2 < nodes2.size())
        d1 = width * (interpolate(values, idx + 2) - f0) / (nodes2[idx + 2] - x0);
    else
        d1 = f1 - f0;

    // Invert definite integral over spline segment
    Float Fhat, fhat;
    auto eval = [&](Float t) -> std::pair<Float, Float> {
        Fhat =
            EvaluatePolynomial(t, 0, f0, .5f * d0, (1.f / 3.f) * (-2 * d0 - d1) + f1 - f0,
                               .25f * (d0 + d1) + .5f * (f0 - f1));
        fhat = EvaluatePolynomial(t, f0, d0, -2 * d0 - d1 + 3 * (f1 - f0),
                                  d0 + d1 + 2 * (f0 - f1));
        return {Fhat - u, fhat};
    };
    Float t = NewtonBisection(0, 1, eval);

    if (fval != nullptr)
        *fval = fhat;
    if (pdf != nullptr)
        *pdf = fhat / maximum;
    return x0 + width * t;
}